

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perrno.c
# Opt level: O3

void err_mess(char *from,int no)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  flush_pty();
  fprintf(_stderr,"System call error: %s errno=%d ",from,no);
  perror("");
  *piVar2 = iVar1;
  return;
}

Assistant:

void err_mess(char *from, int no) {
  int save_errno = errno; /* Save errno around OSMESSAGE_PRINT */

  OSMESSAGE_PRINT({
    (void)fprintf(stderr, "System call error: %s errno=%d ", from, no);
    perror("");
  });

  errno = save_errno;
}